

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall cmCPackGenerator::InstallProject(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  uint uVar8;
  bool bVar9;
  allocator local_20a;
  allocator local_209;
  string local_208;
  string bareTempInstallDirectory;
  string tempInstallDirectoryStr;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"Install projects");
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0xc0,bareTempInstallDirectory._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&bareTempInstallDirectory);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  CleanTemporaryDirectory(this);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_INSTALL_DIRECTORY",
             (allocator *)&tempInstallDirectoryStr);
  pcVar7 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&bareTempInstallDirectory,pcVar7,(allocator *)&local_208);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&tempInstallDirectoryStr,(string *)&bareTempInstallDirectory);
  std::__cxx11::string::string((string *)&cmCPackLog_msg,"CPACK_SET_DESTDIR",&local_209);
  pcVar7 = GetOption(this,(string *)&cmCPackLog_msg);
  bVar2 = cmSystemTools::IsOn(pcVar7);
  std::__cxx11::string::string((string *)&local_208,"CPACK_SET_DESTDIR",&local_20a);
  pcVar7 = GetOption(this,&local_208);
  bVar3 = cmSystemTools::IsInternallyOn(pcVar7);
  bVar9 = bVar2 || bVar3;
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (!bVar2 && !bVar3) {
    (*(this->super_cmObject)._vptr_cmObject[0xc])(this);
    std::__cxx11::string::append((char *)&tempInstallDirectoryStr);
  }
  bVar4 = cmsys::SystemTools::MakeDirectory(bareTempInstallDirectory._M_dataplus._M_p);
  if (bVar4) {
    if (bVar2 || bVar3) {
      std::__cxx11::string::string((string *)&cmCPackLog_msg,"DESTDIR=",(allocator *)&local_208);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      cmsys::SystemTools::PutEnv((string *)&cmCPackLog_msg);
    }
    else {
      std::__cxx11::string::string((string *)&cmCPackLog_msg,"DESTDIR=",(allocator *)&local_208);
      cmsys::SystemTools::PutEnv((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,tempInstallDirectoryStr._M_dataplus._M_p,
               (allocator *)&local_208);
    iVar5 = (*(this->super_cmObject)._vptr_cmObject[0x11])(this,(ulong)bVar9,&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    uVar8 = 0;
    if (iVar5 != 0) {
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,tempInstallDirectoryStr._M_dataplus._M_p,
                 (allocator *)&local_208);
      iVar5 = (*(this->super_cmObject)._vptr_cmObject[0x12])(this,(ulong)bVar9,&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (iVar5 != 0) {
        std::__cxx11::string::string
                  ((string *)&cmCPackLog_msg,tempInstallDirectoryStr._M_dataplus._M_p,
                   (allocator *)&local_208);
        iVar5 = (*(this->super_cmObject)._vptr_cmObject[0x13])(this,(ulong)bVar9,&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        if (iVar5 != 0) {
          iVar5 = (*(this->super_cmObject)._vptr_cmObject[0x14])
                            (this,(ulong)bVar9,&bareTempInstallDirectory);
          if ((bVar2 || bVar3) && iVar5 != 0) {
            std::__cxx11::string::string
                      ((string *)&cmCPackLog_msg,"DESTDIR=",(allocator *)&local_208);
            cmsys::SystemTools::PutEnv((string *)&cmCPackLog_msg);
            std::__cxx11::string::~string((string *)&cmCPackLog_msg);
            uVar8 = 1;
          }
          else {
            uVar8 = (uint)(iVar5 != 0);
          }
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem creating temporary directory: ");
    pcVar7 = "(NULL)";
    if (tempInstallDirectoryStr._M_dataplus._M_p != (pointer)0x0) {
      pcVar7 = tempInstallDirectoryStr._M_dataplus._M_p;
    }
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0xd5,local_208._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    uVar8 = 0;
  }
  std::__cxx11::string::~string((string *)&tempInstallDirectoryStr);
  std::__cxx11::string::~string((string *)&bareTempInstallDirectory);
  return uVar8;
}

Assistant:

int cmCPackGenerator::InstallProject()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Install projects" << std::endl);
  this->CleanTemporaryDirectory();

  std::string bareTempInstallDirectory
    = this->GetOption("CPACK_TEMPORARY_INSTALL_DIRECTORY");
  std::string tempInstallDirectoryStr = bareTempInstallDirectory;
  bool setDestDir = cmSystemTools::IsOn(this->GetOption("CPACK_SET_DESTDIR"))
                  | cmSystemTools::IsInternallyOn(
                    this->GetOption("CPACK_SET_DESTDIR"));
  if (!setDestDir)
    {
    tempInstallDirectoryStr += this->GetPackagingInstallPrefix();
    }

  const char* tempInstallDirectory = tempInstallDirectoryStr.c_str();
  int res = 1;
  if ( !cmsys::SystemTools::MakeDirectory(bareTempInstallDirectory.c_str()))
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
      "Problem creating temporary directory: "
                  << (tempInstallDirectory ? tempInstallDirectory : "(NULL)")
                  << std::endl);
    return 0;
    }

  if ( setDestDir )
    {
    std::string destDir = "DESTDIR=";
    destDir += tempInstallDirectory;
    cmSystemTools::PutEnv(destDir);
    }
  else
    {
    // Make sure there is no destdir
    cmSystemTools::PutEnv("DESTDIR=");
    }

  // If the CPackConfig file sets CPACK_INSTALL_COMMANDS then run them
  // as listed
  if ( !this->InstallProjectViaInstallCommands(
      setDestDir, tempInstallDirectory) )
    {
    return 0;
    }

  // If the CPackConfig file sets CPACK_INSTALL_SCRIPT then run them
  // as listed
  if ( !this->InstallProjectViaInstallScript(
      setDestDir, tempInstallDirectory) )
    {
    return 0;
    }

  // If the CPackConfig file sets CPACK_INSTALLED_DIRECTORIES
  // then glob it and copy it to CPACK_TEMPORARY_DIRECTORY
  // This is used in Source packaging
  if ( !this->InstallProjectViaInstalledDirectories(
      setDestDir, tempInstallDirectory) )
    {
    return 0;
    }


  // If the project is a CMAKE project then run pre-install
  // and then read the cmake_install script to run it
  if ( !this->InstallProjectViaInstallCMakeProjects(
         setDestDir, bareTempInstallDirectory) )
    {
    return 0;
    }

  if ( setDestDir )
    {
    cmSystemTools::PutEnv("DESTDIR=");
    }

  return res;
}